

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_acolyte.cpp
# Opt level: O2

int AF_A_AcolyteDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  PClass *pPVar3;
  long lVar4;
  DThinker *pDVar5;
  DThinker *this_00;
  char *__assertion;
  player_t *this_01;
  FSoundID local_3c;
  TThinkerIterator<AActor> iterator;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005497ba;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005497aa;
  this_00 = (DThinker *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (DThinker *)0x0) goto LAB_00549643;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005497ba;
    }
  }
  else {
    if (this_00 != (DThinker *)0x0) goto LAB_005497aa;
LAB_00549643:
    this_00 = (DThinker *)0x0;
  }
  if (numparam == 1) goto LAB_005496c3;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005497aa:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005497ba;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005497ba;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005497aa;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005496c3:
    *(FRenderStyle *)&this_00[4].super_DObject.Class = LegacyRenderStyles[1];
    pPVar3 = DObject::GetClass(&this_00->super_DObject);
    if ((pPVar3->super_PStruct).super_PNamedType.TypeName.Index == 0x74) {
      this_01 = (player_t *)&players;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        if ((playeringame[lVar4] == true) && (0 < this_01->health)) {
          TThinkerIterator<AActor>::TThinkerIterator
                    ((TThinkerIterator<AActor> *)&iterator.super_FThinkerIterator,NAME_AcolyteBlue,
                     0x80);
          do {
            pDVar5 = FThinkerIterator::Next(&iterator.super_FThinkerIterator);
            if (pDVar5 == (DThinker *)0x0) {
              AActor::GiveInventoryType(&this_01->mo->super_AActor,QuestItemClasses[6]);
              player_t::SetLogNumber(this_01,0xe);
              S_StopSound(2);
              local_3c.ID = S_FindSound("svox/voc14");
              S_Sound(2,&local_3c,1.0,1.0);
              return 0;
            }
          } while ((pDVar5 == this_00) || (*(int *)((long)&pDVar5[8].super_DObject.Class + 4) < 1));
          return 0;
        }
        this_01 = this_01 + 1;
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005497ba:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                ,0x30,"int AF_A_AcolyteDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_AcolyteDie)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	// [RH] Disable translucency here.
	self->RenderStyle = STYLE_Normal;

	// Only the Blue Acolyte does extra stuff on death.
	if (self->GetClass()->TypeName != NAME_AcolyteBlue)
		return 0;

	// Make sure somebody is still alive
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].health > 0)
			break;
	}
	if (i == MAXPLAYERS)
		return 0;

	// Make sure all the other blue acolytes are dead.
	TThinkerIterator<AActor> iterator(NAME_AcolyteBlue);
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != self && other->health > 0)
		{ // Found a living one
			return 0;
		}
	}

	players[i].mo->GiveInventoryType (QuestItemClasses[6]);
	players[i].SetLogNumber (14);
	S_StopSound (CHAN_VOICE);
	S_Sound (CHAN_VOICE, "svox/voc14", 1, ATTN_NORM);
	return 0;
}